

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * ot::commissioner::CommissionerImpl::DecodeChannelMask
                  (Error *__return_storage_ptr__,ChannelMask *aChannelMask,ByteArray *aBuf)

{
  size_type __n;
  const_reference pvVar1;
  byte *pbVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  int local_2e0;
  bool condition;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2d8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2d0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2c8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2c0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2b0;
  anon_class_1_0_00000001 local_292;
  v10 local_291;
  v10 *local_290;
  size_t local_288;
  string local_280;
  Error local_260;
  anon_class_1_0_00000001 local_222;
  v10 local_221;
  v10 *local_220;
  size_t local_218;
  string local_210;
  Error local_1f0;
  byte local_1c1;
  undefined1 local_1c0 [7];
  uint8_t entryLength;
  ChannelMaskEntry entry;
  size_t length;
  size_t offset;
  ChannelMask channelMask;
  ByteArray *aBuf_local;
  ChannelMask *aChannelMask_local;
  Error *error;
  undefined1 local_140 [16];
  v10 *local_130;
  ulong local_128;
  v10 *local_120;
  size_t sStack_118;
  string *local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_108 [2];
  undefined1 local_f8 [16];
  v10 *local_e8;
  ulong local_e0;
  v10 *local_d8;
  size_t sStack_d0;
  string *local_c8;
  v10 *local_c0;
  v10 **local_b8;
  v10 *local_b0;
  v10 **local_a8;
  v10 **local_a0;
  v10 *local_98;
  size_t sStack_90;
  v10 **local_80;
  v10 *local_78;
  size_t sStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_58;
  undefined8 local_50;
  undefined1 *local_48;
  Error **local_40;
  undefined1 *local_38;
  Error **local_30;
  undefined8 local_28;
  undefined1 *local_20;
  Error **local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_10;
  
  channelMask.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  Error::Error(__return_storage_ptr__);
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  vector((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
          *)&offset);
  length = 0;
  entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(aBuf);
  do {
    if (entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage <= length) {
      if ((pointer)length !=
          entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        __assert_fail("condition",
                      "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp"
                      ,0x6b9,
                      "static Error ot::commissioner::CommissionerImpl::DecodeChannelMask(ChannelMask &, const ByteArray &)"
                     );
      }
      std::
      vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
      ::operator=(aChannelMask,
                  (vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                   *)&offset);
      goto LAB_001c3042;
    }
    ChannelMaskEntry::ChannelMaskEntry((ChannelMaskEntry *)local_1c0);
    if (entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage < (pointer)(length + 2)) {
      DecodeChannelMask::anon_class_1_0_00000001::operator()(&local_222);
      local_b8 = &local_220;
      local_c0 = &local_221;
      bVar3 = ::fmt::v10::operator()(local_c0);
      local_218 = bVar3.size_;
      local_220 = (v10 *)bVar3.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_c8 = &local_210;
      local_d8 = local_220;
      sStack_d0 = local_218;
      local_a0 = &local_d8;
      local_e8 = local_220;
      local_e0 = local_218;
      local_98 = local_e8;
      sStack_90 = local_e0;
      local_108[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_60 = local_f8;
      local_68 = local_108;
      local_50 = 0;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_68;
      fmt.size_ = 0;
      fmt.data_ = (char *)local_e0;
      local_58 = local_68;
      local_48 = local_60;
      local_10 = local_68;
      ::fmt::v10::vformat_abi_cxx11_(&local_210,local_e8,fmt,args);
      Error::Error(&local_1f0,kBadFormat,&local_210);
      Error::operator=(__return_storage_ptr__,&local_1f0);
      Error::~Error(&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
      local_2e0 = 6;
    }
    else {
      __n = length + 1;
      pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](aBuf,length);
      local_1c0[0] = *pvVar1;
      length = length + 2;
      pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](aBuf,__n);
      local_1c1 = *pbVar2;
      if (entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage < (pointer)(length + local_1c1)) {
        DecodeChannelMask::anon_class_1_0_00000001::operator()(&local_292);
        local_a8 = &local_290;
        local_b0 = &local_291;
        bVar3 = ::fmt::v10::operator()(local_b0);
        local_288 = bVar3.size_;
        local_290 = (v10 *)bVar3.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_110 = &local_280;
        local_120 = local_290;
        sStack_118 = local_288;
        local_80 = &local_120;
        local_130 = local_290;
        local_128 = local_288;
        local_78 = local_130;
        sStack_70 = local_128;
        error = (Error *)::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>()
        ;
        local_38 = local_140;
        local_40 = &error;
        local_28 = 0;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_40;
        fmt_00.size_ = 0;
        fmt_00.data_ = (char *)local_128;
        local_30 = local_40;
        local_20 = local_38;
        local_18 = local_40;
        ::fmt::v10::vformat_abi_cxx11_(&local_280,local_130,fmt_00,args_00);
        Error::Error(&local_260,kBadFormat,&local_280);
        Error::operator=(__return_storage_ptr__,&local_260);
        Error::~Error(&local_260);
        std::__cxx11::string::~string((string *)&local_280);
        local_2e0 = 6;
      }
      else {
        local_2c0._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(aBuf);
        local_2b8 = __gnu_cxx::
                    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator+(&local_2c0,length);
        local_2d8._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(aBuf);
        local_2d0 = __gnu_cxx::
                    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator+(&local_2d8,length);
        local_2c8 = __gnu_cxx::
                    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator+(&local_2d0,(ulong)local_1c1);
        std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)&condition);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_2b0,local_2b8,
                   local_2c8,(allocator<unsigned_char> *)&condition);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&entry,&local_2b0);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_2b0);
        std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)&condition);
        std::
        vector<ot::commissioner::ChannelMaskEntry,std::allocator<ot::commissioner::ChannelMaskEntry>>
        ::emplace_back<ot::commissioner::ChannelMaskEntry&>
                  ((vector<ot::commissioner::ChannelMaskEntry,std::allocator<ot::commissioner::ChannelMaskEntry>>
                    *)&offset,(ChannelMaskEntry *)local_1c0);
        length = local_1c1 + length;
        local_2e0 = 0;
      }
    }
    ChannelMaskEntry::~ChannelMaskEntry((ChannelMaskEntry *)local_1c0);
  } while (local_2e0 == 0);
  if (local_2e0 == 6) {
LAB_001c3042:
    channelMask.
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  }
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  ~vector((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
           *)&offset);
  if ((channelMask.
       super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::DecodeChannelMask(ChannelMask &aChannelMask, const ByteArray &aBuf)
{
    Error       error;
    ChannelMask channelMask;
    size_t      offset = 0;
    size_t      length = aBuf.size();

    while (offset < length)
    {
        ChannelMaskEntry entry;
        uint8_t          entryLength;
        VerifyOrExit(offset + 2 <= length, error = ERROR_BAD_FORMAT("premature end of Channel Mask Entry"));

        entry.mPage = aBuf[offset++];
        entryLength = aBuf[offset++];

        VerifyOrExit(offset + entryLength <= length, error = ERROR_BAD_FORMAT("premature end of Channel Mask Entry"));
        entry.mMasks = {aBuf.begin() + offset, aBuf.begin() + offset + entryLength};
        channelMask.emplace_back(entry);

        offset += entryLength;
    }

    ASSERT(offset == length);

    aChannelMask = channelMask;

exit:
    return error;
}